

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjalalicalendar.cpp
# Opt level: O2

YearMonthDay __thiscall QJalaliCalendar::julianDayToDate(QJalaliCalendar *this,qint64 jd)

{
  int iVar1;
  qint64 qVar2;
  int iVar3;
  uint uVar4;
  int year;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  R_conflict15 RVar10;
  YearMonthDay YVar11;
  
  RVar10 = QRoundingDown::qDivMod<1029983U,_long_long,_true>(jd + -0x205ee6);
  iVar7 = (int)RVar10.quotient;
  dVar9 = floor((double)((long)iVar7 * -0xfb75f + jd + -0x205ee6) / 365.2421985815603);
  year = (int)dVar9;
  iVar3 = iVar7 * 0xb04 + year + 0x1db;
  qVar2 = firstDayOfYear(year,iVar7);
  iVar6 = ((int)jd - (int)qVar2) + 1;
  iVar1 = (*(this->super_QCalendarBackend)._vptr_QCalendarBackend[4])
                    (this,(ulong)(iVar3 - (uint)(iVar3 < 1)));
  uVar4 = 1;
  iVar3 = iVar6;
  if (iVar1 < iVar6) {
    iVar3 = 1;
  }
  iVar7 = (uint)(iVar1 < iVar6) + iVar7 * 0xb04 + year + 0x1db;
  uVar8 = (ulong)(iVar7 - (uint)(iVar7 < 1));
  uVar5 = uVar8 | 0x100000000;
  while( true ) {
    if (uVar4 == 0xc) break;
    iVar7 = (*(this->super_QCalendarBackend)._vptr_QCalendarBackend[3])(this,(ulong)uVar4,uVar8);
    if (iVar3 - iVar7 == 0 || iVar3 < iVar7) break;
    uVar4 = uVar4 + 1;
    uVar5 = uVar5 + 0x100000000;
    iVar3 = iVar3 - iVar7;
  }
  YVar11.day = iVar3;
  YVar11.year = (int)uVar5;
  YVar11.month = (int)(uVar5 >> 0x20);
  return YVar11;
}

Assistant:

QCalendar::YearMonthDay QJalaliCalendar::julianDayToDate(qint64 jd) const
{
    const int c = cycle(jd);
    int yearInCycle = qFloor((jd - cycleStart(c)) / yearLength);
    int year = yearInCycle + 475 + c * cycleYears;
    int day = jd - firstDayOfYear(yearInCycle, c) + 1;
    if (day > daysInYear(year <= 0 ? year - 1 : year)) {
        ++year;
        day = 1;
    }
    if (year <= 0)
        year--;
    int month;
    for (month = 1; month < 12; ++month) {
        const int last = daysInMonth(month, year);
        if (day <= last)
            break;
        day -= last;
    }
    return QCalendar::YearMonthDay(year, month, day);
}